

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

_Bool oonf_layer2_net_cleanup(oonf_layer2_net *l2net,oonf_layer2_origin *origin,_Bool cleanup_neigh)

{
  char *pcVar1;
  undefined8 *puVar2;
  _Bool _Var3;
  long lVar4;
  list_entity *plVar5;
  byte bVar6;
  
  lVar4 = 0x130;
  _Var3 = false;
  do {
    if (*(oonf_layer2_origin **)(l2net->name + lVar4) == origin) {
      pcVar1 = l2net->name + lVar4 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      _Var3 = true;
    }
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x3b0);
  lVar4 = 0x3b0;
  do {
    if (*(oonf_layer2_origin **)(l2net->name + lVar4) == origin) {
      pcVar1 = l2net->name + lVar4 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
      pcVar1[8] = '\0';
      pcVar1[9] = '\0';
      pcVar1[10] = '\0';
      pcVar1[0xb] = '\0';
      pcVar1[0xc] = '\0';
      pcVar1[0xd] = '\0';
      pcVar1[0xe] = '\0';
      pcVar1[0xf] = '\0';
      _Var3 = true;
    }
    lVar4 = lVar4 + 0x28;
  } while (lVar4 != 0x7c0);
  if ((cleanup_neigh) &&
     (plVar5 = (l2net->neighbors).list_head.next, plVar5->prev != (l2net->neighbors).list_head.prev)
     ) {
    do {
      lVar4 = -0x410;
      bVar6 = 0;
      do {
        if (*(oonf_layer2_origin **)((long)&plVar5[2].next + lVar4) == origin) {
          puVar2 = (undefined8 *)((long)&plVar5[1].prev + lVar4);
          *puVar2 = 0;
          puVar2[1] = 0;
          bVar6 = 1;
        }
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      _Var3 = (_Bool)(_Var3 | bVar6);
      plVar5 = plVar5->next;
    } while (plVar5->prev != (l2net->neighbors).list_head.prev);
  }
  return _Var3;
}

Assistant:

bool
oonf_layer2_net_cleanup(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *origin, bool cleanup_neigh) {
  struct oonf_layer2_neigh *l2neigh;
  bool changed = false;
  int i;

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (l2net->data[i]._origin == origin) {
      oonf_layer2_data_reset(&l2net->data[i]);
      changed = true;
    }
  }
  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (l2net->neighdata[i]._origin == origin) {
      oonf_layer2_data_reset(&l2net->neighdata[i]);
      changed = true;
    }
  }

  if (cleanup_neigh) {
    avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
      changed |= oonf_layer2_neigh_cleanup(l2neigh, origin);
    }
  }
  return changed;
}